

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void UnpackAccumulativeOffsetsIntoRanges
               (int base_codepoint,short *accumulative_offsets,int accumulative_offsets_count,
               ImWchar *out_ranges)

{
  ImWchar IVar1;
  int local_2c;
  ImWchar *pIStack_28;
  int n;
  ImWchar *out_ranges_local;
  int accumulative_offsets_count_local;
  short *accumulative_offsets_local;
  int base_codepoint_local;
  
  pIStack_28 = out_ranges;
  accumulative_offsets_local._4_4_ = base_codepoint;
  for (local_2c = 0; local_2c < accumulative_offsets_count; local_2c = local_2c + 1) {
    IVar1 = (short)accumulative_offsets_local._4_4_ + accumulative_offsets[local_2c];
    pIStack_28[1] = IVar1;
    *pIStack_28 = IVar1;
    accumulative_offsets_local._4_4_ =
         accumulative_offsets[local_2c] + accumulative_offsets_local._4_4_;
    pIStack_28 = pIStack_28 + 2;
  }
  *pIStack_28 = 0;
  return;
}

Assistant:

static void UnpackAccumulativeOffsetsIntoRanges(int base_codepoint, const short* accumulative_offsets, int accumulative_offsets_count, ImWchar* out_ranges)
{
    for (int n = 0; n < accumulative_offsets_count; n++, out_ranges += 2)
    {
        out_ranges[0] = out_ranges[1] = (ImWchar)(base_codepoint + accumulative_offsets[n]);
        base_codepoint += accumulative_offsets[n];
    }
    out_ranges[0] = 0;
}